

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O2

void __thiscall
ParseNodeBin::ParseNodeBin
          (ParseNodeBin *this,OpCode nop,charcount_t ichMin,charcount_t ichLim,ParseNode *pnode1,
          ParseNode *pnode2)

{
  byte *pbVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  char *message;
  char *error;
  uint lineNumber;
  undefined7 in_register_00000031;
  
  (this->super_ParseNode).nop = nop;
  (this->super_ParseNode).grfpn = 0;
  (this->super_ParseNode).location = 0xffffffff;
  (this->super_ParseNode).field_0x1 = ((this->super_ParseNode).field_0x1 & 0xe0) + 1;
  (this->super_ParseNode).ichMin = ichMin;
  (this->super_ParseNode).ichLim = ichLim;
  iVar3 = (int)CONCAT71(in_register_00000031,nop);
  uVar5 = iVar3 - 0x4c;
  if ((uVar5 < 0x26) && ((0x200000000fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
    if ((pnode1->nop == knopStr) || (pnode1->nop == knopComputedName)) goto LAB_00d0e1bf;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = 
    "((nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) || (pnode1->nop == knopStr || pnode1->nop == knopComputedName))"
    ;
    message = 
    "(nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) || (pnode1->nop == knopStr || pnode1->nop == knopComputedName)"
    ;
    lineNumber = 0x135;
  }
  else {
    if ((iVar3 != 0x30) || (pnode2->nop == knopName)) goto LAB_00d0e1bf;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(nop != knopDot || pnode2->nop == knopName)";
    message = "nop != knopDot || pnode2->nop == knopName";
    lineNumber = 0x138;
  }
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/ptree.cpp"
                     ,lineNumber,error,message);
  if (!bVar4) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_00d0e1bf:
  this->pnode1 = pnode1;
  this->pnode2 = pnode2;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ByteCodeConcatExprOptPhase);
  if (((nop == knopAdd) && (!bVar4)) &&
     (((pnode1->grfpn & 0x1000) != 0 || (pnode2->nop == knopStr)))) {
    pbVar1 = (byte *)((long)&(this->super_ParseNode).grfpn + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

ParseNodeBin::ParseNodeBin(OpCode nop, charcount_t ichMin, charcount_t ichLim, ParseNode * pnode1, ParseNode * pnode2)
    : ParseNode(nop, ichMin, ichLim)
{
    // Member name is either a string or a computed name
    Assert((nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) 
        || (pnode1->nop == knopStr || pnode1->nop == knopComputedName));

    // Dot's rhs has to be a name;
    Assert(nop != knopDot || pnode2->nop == knopName);

    this->pnode1 = pnode1;
    this->pnode2 = pnode2;

    // Statically detect if the add is a concat
    if (!PHASE_OFF1(Js::ByteCodeConcatExprOptPhase))
    {
        // We can't flatten the concat expression if the LHS is not a flatten concat already
        // e.g.  a + (<str> + b)
        //      Side effect of ToStr(b) need to happen first before ToStr(a)
        //      If we flatten the concat expression, we will do ToStr(a) before ToStr(b)
        if ((nop == knopAdd) && (pnode1->CanFlattenConcatExpr() || pnode2->nop == knopStr))
        {
            this->grfpn |= fpnCanFlattenConcatExpr;
        }
    }
}